

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  FuncTypeModuleField *pFVar1;
  Location local_70;
  BinaryReaderIR *local_50;
  Index local_44;
  FuncTypeModuleField *local_40;
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> local_38;
  
  local_50 = this;
  local_44 = result_count;
  GetLocation(&local_70,this);
  MakeUnique<wabt::FuncTypeModuleField,wabt::Location>((wabt *)&local_40,&local_70);
  pFVar1 = local_40;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&(local_40->func_type).sig,param_types
             ,param_types + param_count);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&(pFVar1->func_type).sig.result_types,
             result_types,result_types + local_44);
  local_38._M_head_impl = local_40;
  local_40 = (FuncTypeModuleField *)0x0;
  Module::AppendField(local_50->module_,
                      (unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (FuncTypeModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (FuncTypeModuleField *)0x0;
  if (local_40 != (FuncTypeModuleField *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnType(Index index,
                              Index param_count,
                              Type* param_types,
                              Index result_count,
                              Type* result_types) {
  auto field = MakeUnique<FuncTypeModuleField>(GetLocation());
  FuncType& func_type = field->func_type;
  func_type.sig.param_types.assign(param_types, param_types + param_count);
  func_type.sig.result_types.assign(result_types, result_types + result_count);
  module_->AppendField(std::move(field));
  return Result::Ok;
}